

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  handle hVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  PyObject *pPVar5;
  PyTypeObject *pPVar6;
  size_t sVar7;
  void *__dest;
  internals *piVar8;
  handle value;
  handle *phVar9;
  object *object;
  PyTypeObject *pPVar10;
  object module_;
  tuple bases;
  object name;
  object qualname;
  handle local_120;
  handle local_118;
  allocator<char> local_109;
  handle local_108;
  handle local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  object local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  enable_if_t<_detail::is_pyobject<basic_string<char>_>::value_&&_detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_108.m_ptr = (PyObject *)PyUnicode_FromString(rec->name);
  local_100.m_ptr = local_108.m_ptr;
  handle::inc_ref(&local_100);
  pPVar5 = (rec->scope).m_ptr;
  if (pPVar5 == (PyObject *)0x0) {
    local_120.m_ptr = (PyObject *)0x0;
  }
  else {
    iVar4 = _PyObject_TypeCheck(pPVar5,(PyTypeObject *)&PyModule_Type);
    if (iVar4 == 0) {
      bVar2 = hasattr((rec->scope).m_ptr,"__qualname__");
      if (bVar2) {
        local_f8._8_8_ = (rec->scope).m_ptr;
        local_e8._0_8_ = "__qualname__";
        local_e8._8_8_ = (PyObject *)0x0;
        pPVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::ptr
                           ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_f8);
        local_d0._M_dataplus._M_p = (pointer)PyUnicode_FromFormat("%U.%U",pPVar5,local_108.m_ptr);
        pybind11::object::operator=((object *)&local_100,(object *)&local_d0);
        pybind11::object::~object((object *)&local_d0);
        pybind11::object::~object((object *)(local_e8 + 8));
      }
    }
    hVar1.m_ptr = (rec->scope).m_ptr;
    local_120.m_ptr = (PyObject *)0x0;
    if (hVar1.m_ptr != (PyObject *)0x0) {
      bVar2 = hasattr(hVar1,"__module__");
      if (bVar2) {
        local_f8._8_8_ = (rec->scope).m_ptr;
        local_e8._0_8_ = "__module__";
        local_e8._8_8_ = (PyObject *)0x0;
        accessor::operator_cast_to_object((accessor *)&local_d0);
LAB_0014837d:
        pybind11::object::operator=((object *)&local_120,(object *)&local_d0);
        pybind11::object::~object((object *)&local_d0);
        pybind11::object::~object((object *)(local_e8 + 8));
      }
      else {
        bVar2 = hasattr((rec->scope).m_ptr,"__name__");
        if (bVar2) {
          local_f8._8_8_ = (rec->scope).m_ptr;
          local_e8._0_8_ = "__name__";
          local_e8._8_8_ = (PyObject *)0x0;
          accessor::operator_cast_to_object((accessor *)&local_d0);
          goto LAB_0014837d;
        }
      }
      if (local_120.m_ptr != (PyObject *)0x0) {
        str::str((str *)&local_d8,(object *)&local_120);
        cast<std::__cxx11::string>(&local_70,(pybind11 *)&local_d8,object);
        std::operator+(&local_d0,&local_70,".");
        bVar2 = true;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,&local_d0,rec->name);
        goto LAB_0014840e;
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,rec->name,(allocator<char> *)&local_d0);
  bVar2 = false;
LAB_0014840e:
  pPVar6 = (PyTypeObject *)
           c_str<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8)
  ;
  std::__cxx11::string::~string((string *)local_f8);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    pybind11::object::~object(&local_d8);
  }
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    __dest = (void *)0x0;
  }
  else {
    sVar7 = strlen(rec->doc);
    __dest = (void *)PyObject_Malloc(sVar7 + 1);
    memcpy(__dest,rec->doc,sVar7 + 1);
  }
  piVar8 = get_internals();
  tuple::tuple((tuple *)&local_118,&(rec->bases).super_object);
  bVar2 = tuple::empty((tuple *)&local_118);
  if (bVar2) {
    pPVar5 = piVar8->instance_base;
  }
  else {
    local_f8._8_8_ = local_118.m_ptr;
    local_e8._0_8_ = (char *)0x0;
    local_e8._8_8_ = (PyObject *)0x0;
    pPVar5 = accessor<pybind11::detail::accessor_policies::tuple_item>::ptr
                       ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_f8);
    pybind11::object::~object((object *)(local_e8 + 8));
  }
  pPVar10 = (PyTypeObject *)(rec->metaclass).m_ptr;
  if (pPVar10 == (PyTypeObject *)0x0) {
    pPVar10 = piVar8->default_metaclass;
  }
  value.m_ptr = (*pPVar10->tp_alloc)(pPVar10,0);
  hVar1.m_ptr = local_108.m_ptr;
  if (value.m_ptr == (PyObject *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,rec->name,(allocator<char> *)&local_90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   &local_b0,": Unable to create type object!");
    pybind11_fail((string *)local_f8);
  }
  local_108.m_ptr = (PyObject *)0x0;
  value.m_ptr[0x35].ob_refcnt = (Py_ssize_t)hVar1.m_ptr;
  phVar9 = handle::inc_ref(&local_100);
  value.m_ptr[0x36].ob_refcnt = (Py_ssize_t)phVar9->m_ptr;
  value.m_ptr[1].ob_type = pPVar6;
  value.m_ptr[0xb].ob_refcnt = (Py_ssize_t)__dest;
  pPVar5->ob_refcnt = pPVar5->ob_refcnt + 1;
  value.m_ptr[0x10].ob_refcnt = (Py_ssize_t)pPVar5;
  value.m_ptr[2].ob_refcnt = 0x38;
  bVar2 = tuple::empty((tuple *)&local_118);
  hVar1.m_ptr = local_118.m_ptr;
  if (!bVar2) {
    local_118.m_ptr = (PyObject *)0x0;
    value.m_ptr[0x15].ob_refcnt = (Py_ssize_t)hVar1.m_ptr;
  }
  value.m_ptr[0x12].ob_type = (PyTypeObject *)pybind11_object_init;
  value.m_ptr[6].ob_refcnt = (Py_ssize_t)&value.m_ptr[0x1b].ob_type;
  value.m_ptr[6].ob_type = (PyTypeObject *)(value.m_ptr + 0x2f);
  value.m_ptr[7].ob_refcnt = (Py_ssize_t)&value.m_ptr[0x2d].ob_type;
  value.m_ptr[5].ob_refcnt = (Py_ssize_t)&value.m_ptr[0x19].ob_type;
  pPVar6 = value.m_ptr[10].ob_type;
  value.m_ptr[10].ob_type = (PyTypeObject *)((ulong)pPVar6 | 0x200);
  bVar3 = rec->field_0x80;
  if ((bVar3 & 0x20) == 0) {
    value.m_ptr[10].ob_type = (PyTypeObject *)((ulong)pPVar6 | 0x600);
    bVar3 = rec->field_0x80;
  }
  if ((bVar3 & 2) != 0) {
    enable_dynamic_attributes((PyHeapTypeObject *)value.m_ptr);
    bVar3 = rec->field_0x80;
  }
  if ((bVar3 & 4) != 0) {
    value.m_ptr[10].ob_refcnt = (Py_ssize_t)(value.m_ptr + 0x34);
    value.m_ptr[0x34].ob_refcnt = (Py_ssize_t)pybind11_getbuffer;
    value.m_ptr[0x34].ob_type = (PyTypeObject *)pybind11_releasebuffer;
  }
  if ((rec->custom_type_setup_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(_heaptypeobject_*)>::operator()
              (&rec->custom_type_setup_callback,(_heaptypeobject *)value.m_ptr);
  }
  iVar4 = PyType_Ready(value.m_ptr);
  if (-1 < iVar4) {
    if (((rec->field_0x80 & 2) != 0) && (((ulong)value.m_ptr[10].ob_type & 0x4000) == 0)) {
      __assert_fail("!rec.dynamic_attr || PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/detail/class.h"
                    ,0x2df,"PyObject *pybind11::detail::make_new_python_type(const type_record &)");
    }
    hVar1.m_ptr = (rec->scope).m_ptr;
    if (hVar1.m_ptr == (PyObject *)0x0) {
      (value.m_ptr)->ob_refcnt = (value.m_ptr)->ob_refcnt + 1;
    }
    else {
      setattr(hVar1,rec->name,value);
    }
    if (local_120.m_ptr != (PyObject *)0x0) {
      setattr(value,"__module__",local_120);
    }
    pybind11::object::~object((object *)&local_118);
    pybind11::object::~object((object *)&local_120);
    pybind11::object::~object((object *)&local_100);
    pybind11::object::~object((object *)&local_108);
    return value.m_ptr;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,rec->name,&local_109);
  std::operator+(&local_b0,&local_90,": PyType_Ready failed: ");
  error_string_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 &local_b0,&local_50);
  pybind11_fail((string *)local_f8);
}

Assistant:

inline PyObject *make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

    auto qualname = name;
    if (rec.scope && !PyModule_Check(rec.scope.ptr()) && hasattr(rec.scope, "__qualname__")) {
        qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
    }

    object module_;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__")) {
            module_ = rec.scope.attr("__module__");
        } else if (hasattr(rec.scope, "__name__")) {
            module_ = rec.scope.attr("__name__");
        }
    }

    const auto *full_name = c_str(
#if !defined(PYPY_VERSION)
        module_ ? str(module_).cast<std::string>() + "." + rec.name :
#endif
                rec.name);

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (Python will free this later on) */
        size_t size = std::strlen(rec.doc) + 1;
#if PY_VERSION_HEX >= 0x030D0000
        tp_doc = (char *) PyMem_MALLOC(size);
#else
        tp_doc = (char *) PyObject_MALLOC(size);
#endif
        std::memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto *base = (bases.empty()) ? internals.instance_base : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto *metaclass
        = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr() : internals.default_metaclass;

    auto *heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type) {
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");
    }

    heap_type->ht_name = name.release().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = qualname.inc_ref().ptr();
#endif

    auto *type = &heap_type->ht_type;
    type->tp_name = full_name;
    type->tp_doc = tp_doc;
    type->tp_base = type_incref((PyTypeObject *) base);
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (!bases.empty()) {
        type->tp_bases = bases.release().ptr();
    }

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;
    type->tp_as_async = &heap_type->as_async;

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_HEAPTYPE;
    if (!rec.is_final) {
        type->tp_flags |= Py_TPFLAGS_BASETYPE;
    }

    if (rec.dynamic_attr) {
        enable_dynamic_attributes(heap_type);
    }

    if (rec.buffer_protocol) {
        enable_buffer_protocol(heap_type);
    }

    if (rec.custom_type_setup_callback) {
        rec.custom_type_setup_callback(heap_type);
    }

    if (PyType_Ready(type) < 0) {
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed: " + error_string());
    }

    assert(!rec.dynamic_attr || PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope) {
        setattr(rec.scope, rec.name, (PyObject *) type);
    } else {
        Py_INCREF(type); // Keep it alive forever (reference leak)
    }

    if (module_) { // Needed by pydoc
        setattr((PyObject *) type, "__module__", module_);
    }

    PYBIND11_SET_OLDPY_QUALNAME(type, qualname);

    return (PyObject *) type;
}